

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::skip_space
          (basic_json_parser<char,_std::allocator<char>_> *this,char_type **ptr)

{
  undefined8 *in_RSI;
  long in_RDI;
  char_type *cur;
  char_type *local_input_end;
  basic_json_parser<char,_std::allocator<char>_> *pbVar1;
  basic_json_parser<char,_std::allocator<char>_> *this_00;
  
  pbVar1 = (basic_json_parser<char,_std::allocator<char>_> *)*in_RSI;
  while (pbVar1 < *(basic_json_parser<char,_std::allocator<char>_> **)(in_RDI + 0x68)) {
    if ((*(char *)&(pbVar1->super_ser_context)._vptr_ser_context == ' ') ||
       (*(char *)&(pbVar1->super_ser_context)._vptr_ser_context == '\t')) {
      *(long *)(in_RDI + 0x48) = *(long *)(in_RDI + 0x48) + 1;
      pbVar1 = (basic_json_parser<char,_std::allocator<char>_> *)
               ((long)&(pbVar1->super_ser_context)._vptr_ser_context + 1);
    }
    else if (*(char *)&(pbVar1->super_ser_context)._vptr_ser_context == '\n') {
      *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) + 1;
      *(long *)(in_RDI + 0x48) = *(long *)(in_RDI + 0x48) + 1;
      *(undefined8 *)(in_RDI + 0x50) = *(undefined8 *)(in_RDI + 0x48);
      pbVar1 = (basic_json_parser<char,_std::allocator<char>_> *)
               ((long)&(pbVar1->super_ser_context)._vptr_ser_context + 1);
    }
    else {
      if (*(char *)&(pbVar1->super_ser_context)._vptr_ser_context != '\r') break;
      this_00 = (basic_json_parser<char,_std::allocator<char>_> *)
                ((long)&(pbVar1->super_ser_context)._vptr_ser_context + 1);
      *(long *)(in_RDI + 0x48) = *(long *)(in_RDI + 0x48) + 1;
      if (*(basic_json_parser<char,_std::allocator<char>_> **)(in_RDI + 0x68) <= this_00) {
        push_state(this_00,(parse_state)((ulong)in_RDI >> 0x38));
        *(undefined1 *)(in_RDI + 0x78) = 0x1c;
        *in_RSI = this_00;
        return;
      }
      *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) + 1;
      if (*(char *)&(this_00->super_ser_context)._vptr_ser_context == '\n') {
        this_00 = (basic_json_parser<char,_std::allocator<char>_> *)
                  ((long)&(pbVar1->super_ser_context)._vptr_ser_context + 2);
        *(long *)(in_RDI + 0x48) = *(long *)(in_RDI + 0x48) + 1;
      }
      *(undefined8 *)(in_RDI + 0x50) = *(undefined8 *)(in_RDI + 0x48);
      pbVar1 = this_00;
    }
  }
  *in_RSI = pbVar1;
  return;
}

Assistant:

void skip_space(char_type const ** ptr)
    {
        const char_type* local_input_end = end_input_;
        const char_type* cur = *ptr;

        while (cur < local_input_end) 
        {
            if (*cur == ' ' || *cur == '\t')
            {
                ++cur;
                ++position_;
                continue;
            }
            if (*cur == '\n')
            {
                ++cur;
                ++line_;
                ++position_;
                mark_position_ = position_;
                continue;
            }
            if (*cur == '\r')
            {
                ++cur;
                ++position_;
                if (cur < local_input_end)
                {
                    ++line_;
                    if (*cur == '\n')
                    {
                        ++cur;
                        ++position_;
                    }
                    mark_position_ = position_;
                }
                else
                {
                    push_state(state_);
                    state_ = parse_state::cr;
                    *ptr = cur;
                    return; 
                }
                continue;
            }
            break;
        }
        *ptr = cur;
    }